

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void init_displaychars(void)

{
  int iVar1;
  nh_drawing_info *orig;
  nh_drawing_info *dinfo;
  wchar_t i;
  
  orig = (nh_drawing_info *)nh_get_drawing_info();
  default_drawing = load_nh_drawing_info(orig);
  unicode_drawing = load_nh_drawing_info(orig);
  rogue_drawing = load_nh_drawing_info(orig);
  apply_override(unicode_drawing,unicode_graphics_ovr,L'*','\0');
  apply_override(rogue_drawing,rogue_graphics_ovr,L'\n','\0');
  read_unisym_config();
  cur_drawing = default_drawing;
  for (dinfo._4_4_ = L'\0'; dinfo._4_4_ < cur_drawing->num_bgelements;
      dinfo._4_4_ = dinfo._4_4_ + L'\x01') {
    iVar1 = strcmp("altar",cur_drawing->bgelements[dinfo._4_4_].symname);
    if (iVar1 == 0) {
      altar_id = dinfo._4_4_;
    }
    else {
      iVar1 = strcmp("vwall",cur_drawing->bgelements[dinfo._4_4_].symname);
      if (iVar1 == 0) {
        vwall_id = dinfo._4_4_;
      }
      else {
        iVar1 = strcmp("trwall",cur_drawing->bgelements[dinfo._4_4_].symname);
        if (iVar1 == 0) {
          trwall_id = dinfo._4_4_;
        }
        else {
          iVar1 = strcmp("room",cur_drawing->bgelements[dinfo._4_4_].symname);
          if (iVar1 == 0) {
            room_id = dinfo._4_4_;
          }
          else {
            iVar1 = strcmp("darkroom",cur_drawing->bgelements[dinfo._4_4_].symname);
            if (iVar1 == 0) {
              darkroom_id = dinfo._4_4_;
            }
            else {
              iVar1 = strcmp("ndoor",cur_drawing->bgelements[dinfo._4_4_].symname);
              if (iVar1 == 0) {
                ndoor_id = dinfo._4_4_;
              }
              else {
                iVar1 = strcmp("vcdoor",cur_drawing->bgelements[dinfo._4_4_].symname);
                if (iVar1 == 0) {
                  vcdoor_id = dinfo._4_4_;
                }
                else {
                  iVar1 = strcmp("hcdoor",cur_drawing->bgelements[dinfo._4_4_].symname);
                  if (iVar1 == 0) {
                    hcdoor_id = dinfo._4_4_;
                  }
                  else {
                    iVar1 = strcmp("upstair",cur_drawing->bgelements[dinfo._4_4_].symname);
                    if (iVar1 == 0) {
                      upstair_id = dinfo._4_4_;
                    }
                    else {
                      iVar1 = strcmp("upladder",cur_drawing->bgelements[dinfo._4_4_].symname);
                      if (iVar1 == 0) {
                        upladder_id = dinfo._4_4_;
                      }
                      else {
                        iVar1 = strcmp("upsstair",cur_drawing->bgelements[dinfo._4_4_].symname);
                        if (iVar1 == 0) {
                          upsstair_id = dinfo._4_4_;
                        }
                        else {
                          iVar1 = strcmp("dnstair",cur_drawing->bgelements[dinfo._4_4_].symname);
                          if (iVar1 == 0) {
                            dnstair_id = dinfo._4_4_;
                          }
                          else {
                            iVar1 = strcmp("dnladder",cur_drawing->bgelements[dinfo._4_4_].symname);
                            if (iVar1 == 0) {
                              dnladder_id = dinfo._4_4_;
                            }
                            else {
                              iVar1 = strcmp("dnsstair",cur_drawing->bgelements[dinfo._4_4_].symname
                                            );
                              if (iVar1 == 0) {
                                dnsstair_id = dinfo._4_4_;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  for (dinfo._4_4_ = L'\0'; dinfo._4_4_ < cur_drawing->num_traps;
      dinfo._4_4_ = dinfo._4_4_ + L'\x01') {
    iVar1 = strcmp("magic portal",cur_drawing->traps[dinfo._4_4_].symname);
    if (iVar1 == 0) {
      mportal_id = dinfo._4_4_;
    }
    else {
      iVar1 = strcmp("vibrating square",cur_drawing->traps[dinfo._4_4_].symname);
      if (iVar1 == 0) {
        vibsquare_id = dinfo._4_4_;
      }
    }
  }
  for (dinfo._4_4_ = L'\0'; dinfo._4_4_ < cur_drawing->num_objects;
      dinfo._4_4_ = dinfo._4_4_ + L'\x01') {
    iVar1 = strcmp("corpse",cur_drawing->objects[dinfo._4_4_].symname);
    if (iVar1 == 0) {
      corpse_id = dinfo._4_4_;
    }
  }
  switch_graphics(settings.graphics);
  return;
}

Assistant:

void init_displaychars(void)
{
    int i;
    struct nh_drawing_info *dinfo = nh_get_drawing_info();
    
    default_drawing = load_nh_drawing_info(dinfo);
    unicode_drawing = load_nh_drawing_info(dinfo);
    rogue_drawing = load_nh_drawing_info(dinfo);
    
    apply_override(unicode_drawing, unicode_graphics_ovr,
		   array_size(unicode_graphics_ovr), FALSE);
    apply_override(rogue_drawing, rogue_graphics_ovr, array_size(rogue_graphics_ovr), FALSE);
    
    read_unisym_config();
    
    cur_drawing = default_drawing;

    /* find bg elements that could use special treatment */
    for (i = 0; i < cur_drawing->num_bgelements; i++) {
	if (!strcmp("altar", cur_drawing->bgelements[i].symname))
	    altar_id = i;
	else if (!strcmp("vwall", cur_drawing->bgelements[i].symname))
	    vwall_id = i;
	else if (!strcmp("trwall", cur_drawing->bgelements[i].symname))
	    trwall_id = i;
	else if (!strcmp("room", cur_drawing->bgelements[i].symname))
	    room_id = i;
	else if (!strcmp("darkroom", cur_drawing->bgelements[i].symname))
	    darkroom_id = i;
	else if (!strcmp("ndoor", cur_drawing->bgelements[i].symname))
	    ndoor_id = i;
	else if (!strcmp("vcdoor", cur_drawing->bgelements[i].symname))
	    vcdoor_id = i;
	else if (!strcmp("hcdoor", cur_drawing->bgelements[i].symname))
	    hcdoor_id = i;
	else if (!strcmp("upstair", cur_drawing->bgelements[i].symname))
	    upstair_id = i;
	else if (!strcmp("upladder", cur_drawing->bgelements[i].symname))
	    upladder_id = i;
	else if (!strcmp("upsstair", cur_drawing->bgelements[i].symname))
	    upsstair_id = i;
	else if (!strcmp("dnstair", cur_drawing->bgelements[i].symname))
	    dnstair_id = i;
	else if (!strcmp("dnladder", cur_drawing->bgelements[i].symname))
	    dnladder_id = i;
	else if (!strcmp("dnsstair", cur_drawing->bgelements[i].symname))
	    dnsstair_id = i;
    }

    /* find traps that could use special treatment */
    for (i = 0; i < cur_drawing->num_traps; i++) {
	if (!strcmp("magic portal", cur_drawing->traps[i].symname))
	    mportal_id = i;
	else if (!strcmp("vibrating square", cur_drawing->traps[i].symname))
	    vibsquare_id = i;
    }

    /* find objects that could use special treatment */
    for (i = 0; i < cur_drawing->num_objects; i++) {
	if (!strcmp("corpse", cur_drawing->objects[i].symname))
	    corpse_id = i;
    }

    /* options are parsed before display is initialized, so redo switch */
    switch_graphics(settings.graphics);
}